

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# botp.c
# Opt level: O0

err_t botpTOTPRand(char *otp,size_t digit,octet *key,size_t key_len,tm_time_t t)

{
  bool_t bVar1;
  blob_t pvVar2;
  size_t in_RCX;
  octet *in_RDX;
  ulong in_RSI;
  char *in_RDI;
  long in_R8;
  void *state;
  size_t in_stack_ffffffffffffffc8;
  err_t local_4;
  
  if ((in_RSI < 6) || (8 < in_RSI)) {
    local_4 = 0x1f6;
  }
  else if (in_R8 == -1) {
    local_4 = 0x133;
  }
  else {
    bVar1 = memIsValid(in_RDI,in_RSI + 1);
    if ((bVar1 != 0) && (bVar1 = memIsValid(in_RDX,in_RCX), bVar1 != 0)) {
      botpTOTP_keep();
      pvVar2 = blobCreate(in_stack_ffffffffffffffc8);
      if (pvVar2 == (blob_t)0x0) {
        return 0x6e;
      }
      botpTOTPStart(in_RDI,in_RSI,in_RDX,in_RCX);
      botpTOTPStepR(in_RDI,in_RSI,in_RDX);
      blobClose((blob_t)0x16b92b);
      return 0;
    }
    local_4 = 0x6d;
  }
  return local_4;
}

Assistant:

err_t botpTOTPRand(char* otp, size_t digit, const octet key[], size_t key_len, 
	tm_time_t t)
{
	void* state;
	// проверить входные данные
	if (digit < 6 || digit > 8)
		return ERR_BAD_PARAMS;
	if (t == TIME_ERR)
		return ERR_BAD_TIME;
	if (!memIsValid(otp, digit + 1) || 
		!memIsValid(key, key_len))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(botpTOTP_keep());
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// сгенерировать пароль
	botpTOTPStart(state, digit, key, key_len);
	botpTOTPStepR(otp, t, state);
	// завершить
	blobClose(state);
	return ERR_OK;
}